

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Collision_PDU::Collision_PDU(Collision_PDU *this,KDataStream *stream)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Collision_PDU_00215650;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_IssuingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_CollidingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID);
  DATA_TYPE::Vector::Vector(&this->m_Velocity);
  DATA_TYPE::Vector::Vector(&this->m_Location);
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Collision_PDU::Collision_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}